

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconnect.cpp
# Opt level: O2

void __thiscall ReconnectingHub::~ReconnectingHub(ReconnectingHub *this)

{
  ~ReconnectingHub(this);
  operator_delete(this,0xa0);
  return;
}

Assistant:

ReconnectingHub(const string& target) :
		connected(false),
		target(target)
	{
		connectToTarget();
	}